

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::growHi(BoxArray *this,int dir,int n_cell)

{
  Long LVar1;
  Box *this_00;
  int in_EDX;
  int in_ESI;
  BoxArray *in_RDI;
  int i;
  int N;
  BoxArray *in_stack_00000138;
  size_type in_stack_ffffffffffffffd8;
  undefined4 local_18;
  
  uniqify(in_stack_00000138);
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x125b72e);
  LVar1 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x125b736);
  for (local_18 = 0; local_18 < (int)LVar1; local_18 = local_18 + 1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x125b75a);
    this_00 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI,
                         in_stack_ffffffffffffffd8);
    Box::growHi(this_00,in_ESI,in_EDX);
  }
  return in_RDI;
}

Assistant:

BoxArray&
BoxArray::growHi (int dir,
                  int n_cell)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].growHi(dir, n_cell);
    }
    return *this;
}